

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)> * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>
::Iterator::Current(Iterator *this)

{
  pointer pFVar1;
  undefined8 *puVar2;
  reference pFVar3;
  long in_RDI;
  pointer in_stack_ffffffffffffffd8;
  unique_ptr<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::default_delete<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>
  *in_stack_ffffffffffffffe0;
  
  pFVar1 = std::
           unique_ptr<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::default_delete<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>
           ::get(in_stack_ffffffffffffffe0);
  if (pFVar1 == (pointer)0x0) {
    in_stack_ffffffffffffffe0 =
         (unique_ptr<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::default_delete<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>
          *)(in_RDI + 0x18);
    puVar2 = (undefined8 *)operator_new(0x18);
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_*,_std::vector<libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::allocator<libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>_>
             ::operator*((__normal_iterator<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_*,_std::vector<libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::allocator<libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>_>
                          *)(in_RDI + 0x10));
    *puVar2 = pFVar3->ref_func;
    puVar2[1] = pFVar3->tst_func;
    puVar2[2] = *(undefined8 *)&pFVar3->bit_depth;
    std::
    unique_ptr<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::default_delete<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>
    ::reset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  pFVar1 = std::
           unique_ptr<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>,_std::default_delete<const_libaom_test::FuncParam<signed_char_(*)(const_short_*,_const_unsigned_char_*,_int,_long)>_>_>
           ::get(in_stack_ffffffffffffffe0);
  return pFVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }